

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall glu::sl::ShaderParser::parseValueBlock(ShaderParser *this,ValueBlock *valueBlock)

{
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  advanceToken(this,TOKEN_VALUES);
  advanceToken(this,TOKEN_LEFT_BRACE);
  while (this->m_curToken - TOKEN_UNIFORM < 3) {
    parseValue(this,valueBlock);
  }
  if (this->m_curToken == TOKEN_RIGHT_BRACE) {
    advanceToken(this,TOKEN_RIGHT_BRACE);
    return;
  }
  std::operator+(&local_30,"unexpected token when parsing a value block: ",&this->m_curTokenStr);
  parseError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValueBlock (ValueBlock& valueBlock)
{
	PARSE_DBG(("    parseValueBlock()\n"));
	advanceToken(TOKEN_VALUES);
	advanceToken(TOKEN_LEFT_BRACE);

	for (;;)
	{
		if (m_curToken == TOKEN_UNIFORM || m_curToken == TOKEN_INPUT || m_curToken == TOKEN_OUTPUT)
			parseValue(valueBlock);
		else if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else
			parseError(string("unexpected token when parsing a value block: " + m_curTokenStr));
	}

	advanceToken(TOKEN_RIGHT_BRACE);
}